

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O2

void __thiscall StreamSummary<4U>::~StreamSummary(StreamSummary<4U> *this)

{
  StreamBucket *pSVar1;
  StreamCounter *pSVar2;
  StreamCounter *pSVar3;
  StreamBucket *pSVar4;
  
  pSVar4 = this->min_bucket;
  while (pSVar4 != (StreamBucket *)0x0) {
    pSVar1 = (StreamBucket *)(pSVar4->super_Node<int>).next;
    pSVar3 = pSVar4->child;
    while (pSVar3 != (StreamCounter *)0x0) {
      pSVar2 = (StreamCounter *)(pSVar3->super_Node<Data<4U>_>).next;
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->mp)._M_h,pSVar3);
      operator_delete(pSVar3,0x20);
      pSVar3 = pSVar2;
    }
    operator_delete(pSVar4,0x20);
    pSVar4 = pSVar1;
  }
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mp)._M_h);
  return;
}

Assistant:

~StreamSummary() {
		StreamBucket* temp_bucket = min_bucket, * next_bucket;

		while (temp_bucket != NULL) {
			next_bucket = (StreamBucket*)temp_bucket->next;

			StreamCounter* temp_counter = temp_bucket->child, * next_counter;
			while (temp_counter != NULL) {
				next_counter = (StreamCounter*)temp_counter->next;
				mp.erase(temp_counter->ID);
				delete temp_counter;
				temp_counter = next_counter;
			}

			delete temp_bucket;
			temp_bucket = next_bucket;
		}
	}